

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

int64_t kratos::convert_string_to_int(string *value)

{
  ulong uVar1;
  byte bVar2;
  size_type sVar3;
  
  bVar2 = 0;
  uVar1 = 0;
  for (sVar3 = value->_M_string_length; sVar3 != 0; sVar3 = sVar3 - 1) {
    uVar1 = uVar1 | (long)(value->_M_dataplus)._M_p[sVar3 - 1] << (bVar2 & 0x3f);
    bVar2 = bVar2 + 8;
  }
  return uVar1;
}

Assistant:

int64_t convert_string_to_int(const std::string &value) {
    int64_t converted_value = 0;
    // SystemVerilog uses reverse order if it's [hi:lo] (kratos does that)
    int64_t idx = 0;
    for (auto it = value.rbegin(); it != value.rend(); it++) {
        auto c = static_cast<int64_t>(*it);  // NOLINT
        converted_value |= c << idx;
        idx += 8;
    }
    return converted_value;
}